

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::resolver::on_lookup
          (resolver *this,error_code *ec,results_type *ips,string *hostname)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>_>
  *this_00;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  *this_01;
  long lVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
  _Var2;
  _Base_ptr p_Var3;
  pointer paVar4;
  long lVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
  _Var6;
  error_category *peVar7;
  bool bVar8;
  undefined3 uVar9;
  resolver *prVar10;
  mapped_type *pmVar11;
  time_point tVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  iterator __it;
  mapped_type *pmVar15;
  const_iterator cVar16;
  element_type *peVar17;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
  __it_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
  __it_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  long lVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  pVar19;
  basic_resolver_entry<boost::asio::ip::tcp> i;
  long local_120;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_118;
  uint local_100;
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  _Any_data local_b8;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Any_data local_98;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_70;
  string *local_68;
  resolver *local_60;
  error_code *local_58;
  address local_50;
  
  this_00 = &this->m_failed_cache;
  if (ec->failed_ == true) {
    pmVar11 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,hostname);
    tVar12 = time_now();
    (pmVar11->last_seen).__d.__r = (rep)tVar12.__d.__r;
    bVar8 = ec->failed_;
    uVar9 = *(undefined3 *)&ec->field_0x5;
    peVar7 = ec->cat_;
    (pmVar11->error).val_ = ec->val_;
    (pmVar11->error).failed_ = bVar8;
    *(undefined3 *)&(pmVar11->error).field_0x5 = uVar9;
    (pmVar11->error).cat_ = peVar7;
    if (this->m_max_size < (int)(this->m_failed_cache)._M_h._M_element_count) {
      _Var2._M_cur = (__node_type *)(this->m_failed_cache)._M_h._M_before_begin._M_nxt;
      __it_00._M_cur = _Var2._M_cur;
      for (; _Var2._M_cur != (__node_type *)0x0;
          _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
        if (*(long *)((long)&((_Var2._M_cur)->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>
                             ._M_storage._M_storage + 0x20) < *(long *)((long)__it_00._M_cur + 0x28)
           ) {
          __it_00._M_cur = _Var2._M_cur;
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&this_00->_M_h,(const_iterator)__it_00._M_cur);
    }
    pVar19 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
             ::equal_range(&(this->m_callbacks)._M_t,hostname);
    cVar16._M_node = (_Base_ptr)pVar19.second._M_node;
    cVar13._M_node = (_Base_ptr)pVar19.first._M_node;
    if (cVar13._M_node != cVar16._M_node) {
      cVar14._M_node = cVar13._M_node;
      do {
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = (_Base_ptr)0x0;
        local_88 = (_Base_ptr)0x0;
        local_80 = cVar14._M_node[2]._M_right;
        p_Var3 = cVar14._M_node[2]._M_left;
        if (p_Var3 != (_Base_ptr)0x0) {
          local_98._M_unused._0_8_ = (undefined8)*(undefined8 *)(cVar14._M_node + 2);
          local_98._8_8_ = cVar14._M_node[2]._M_parent;
          cVar14._M_node[2]._M_left = (_Base_ptr)0x0;
          cVar14._M_node[2]._M_right = (_Base_ptr)0x0;
          local_88 = p_Var3;
        }
        local_118.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_5::callback((callback_t *)&local_98,ec,&local_118);
        if (local_118.
            super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.
                          super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_88 != (_Base_ptr)0x0) {
          (*(code *)local_88)(&local_98,&local_98,3);
        }
        cVar14._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar14._M_node);
      } while (cVar14._M_node != cVar16._M_node);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
    ::_M_erase_aux(&(this->m_callbacks)._M_t,cVar13,cVar16);
  }
  else {
    __it = ::std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&this_00->_M_h,hostname);
    if (__it.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
        ._M_cur != (__node_type *)0x0) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&this_00->_M_h,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
              ._M_cur);
    }
    local_70 = &(this->m_cache)._M_h;
    local_68 = hostname;
    local_58 = ec;
    pmVar15 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)local_70,hostname);
    tVar12 = time_now();
    (pmVar15->last_seen).__d.__r = (rep)tVar12.__d.__r;
    paVar4 = (pmVar15->addresses).
             super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pmVar15->addresses).
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish != paVar4) {
      (pmVar15->addresses).
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish = paVar4;
    }
    peVar17 = (ips->super_basic_resolver_iterator<boost::asio::ip::tcp>).values_.
              super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    this_02 = (ips->super_basic_resolver_iterator<boost::asio::ip::tcp>).values_.
              super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
    }
    local_60 = this;
    if (peVar17 != (element_type *)0x0) {
      local_120 = 0;
      this_03 = this_02;
      do {
        lVar5 = *(long *)&(peVar17->
                          super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                          )._M_impl.super__Vector_impl_data;
        lVar18 = local_120 * 0x60;
        local_118.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar5 + lVar18);
        local_118.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)((undefined8 *)(lVar5 + lVar18))[1];
        lVar1 = lVar5 + 0xc + lVar18;
        local_118.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + 4);
        local_100 = *(uint *)(lVar1 + 0xc);
        local_f8[0] = local_e8;
        lVar1 = *(long *)(lVar5 + 0x20 + lVar18);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f8,lVar1,*(long *)(lVar5 + 0x28 + lVar18) + lVar1);
        lVar1 = *(long *)(lVar5 + lVar18 + 0x40);
        local_d8[0] = local_c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,lVar1,*(long *)(lVar5 + lVar18 + 0x48) + lVar1);
        if ((short)local_118.
                   super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                   ._M_impl.super__Vector_impl_data._M_start == 2) {
          local_50._0_8_ =
               (ulong)local_118.
                      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000;
          local_50.ipv6_address_.addr_.__in6_u._0_8_ = (pointer)0x0;
          local_50.ipv6_address_.addr_.__in6_u._8_8_ = (pointer)0x0;
          local_50.ipv6_address_.scope_id_ = 0;
        }
        else {
          local_50.ipv6_address_.scope_id_ = (unsigned_long)local_100;
          local_50.ipv6_address_.addr_.__in6_u._0_8_ =
               local_118.
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_50.ipv6_address_.addr_.__in6_u._8_8_ =
               local_118.
               super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_50.type_ = ipv6;
          local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
        }
        ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
        emplace_back<boost::asio::ip::address>(&pmVar15->addresses,&local_50);
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],local_e8[0] + 1);
        }
        local_120 = local_120 + 1;
        this_02 = this_03;
        if (local_120 ==
            ((long)*(pointer *)
                    ((long)&(peVar17->
                            super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                            )._M_impl.super__Vector_impl_data + 8) -
             *(long *)&(peVar17->
                       super__Vector_base<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>
                       )._M_impl.super__Vector_impl_data >> 5) * -0x5555555555555555) {
          peVar17 = (element_type *)0x0;
          local_120 = 0;
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
            peVar17 = (element_type *)0x0;
            local_120 = 0;
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
        }
        this_03 = this_02;
      } while (peVar17 != (element_type *)0x0);
    }
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
    prVar10 = local_60;
    this_01 = &local_60->m_callbacks;
    pVar19 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
             ::equal_range(&this_01->_M_t,local_68);
    cVar16._M_node = (_Base_ptr)pVar19.second._M_node;
    cVar13._M_node = (_Base_ptr)pVar19.first._M_node;
    if (cVar13._M_node != cVar16._M_node) {
      cVar14._M_node = cVar13._M_node;
      do {
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = (_Base_ptr)0x0;
        local_a8 = (_Base_ptr)0x0;
        local_a0 = cVar14._M_node[2]._M_right;
        p_Var3 = cVar14._M_node[2]._M_left;
        if (p_Var3 != (_Base_ptr)0x0) {
          local_b8._M_unused._0_8_ = (undefined8)*(undefined8 *)(cVar14._M_node + 2);
          local_b8._8_8_ = cVar14._M_node[2]._M_parent;
          cVar14._M_node[2]._M_left = (_Base_ptr)0x0;
          cVar14._M_node[2]._M_right = (_Base_ptr)0x0;
          local_a8 = p_Var3;
        }
        anon_unknown_5::callback((callback_t *)&local_b8,local_58,&pmVar15->addresses);
        if (local_a8 != (_Base_ptr)0x0) {
          (*(code *)local_a8)(&local_b8,&local_b8,3);
        }
        cVar14._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar14._M_node);
      } while (cVar14._M_node != cVar16._M_node);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
    ::_M_erase_aux(&this_01->_M_t,cVar13,cVar16);
    if (prVar10->m_max_size < (int)(prVar10->m_cache)._M_h._M_element_count) {
      _Var6._M_cur = (__node_type *)(prVar10->m_cache)._M_h._M_before_begin._M_nxt;
      __it_01._M_cur = _Var6._M_cur;
      for (; _Var6._M_cur != (__node_type *)0x0;
          _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt) {
        if (*(long *)((long)&((_Var6._M_cur)->
                             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>
                             ._M_storage._M_storage + 0x20) < *(long *)((long)__it_01._M_cur + 0x28)
           ) {
          __it_01._M_cur = _Var6._M_cur;
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(local_70,(const_iterator)__it_01._M_cur);
    }
  }
  return;
}

Assistant:

void resolver::on_lookup(error_code const& ec, tcp::resolver::results_type ips
		, std::string const& hostname)
	{
		COMPLETE_ASYNC("resolver::on_lookup");
		if (ec)
		{
			failed_dns_cache_entry& ce = m_failed_cache[hostname];
			ce.last_seen = time_now();
			ce.error = ec;

			// if the cache grows too big, weed out the
			// oldest entries
			if (int(m_failed_cache.size()) > m_max_size)
			{
				auto oldest = m_failed_cache.begin();
				for (auto k = m_failed_cache.begin(); k != m_failed_cache.end(); ++k)
				{
					if (k->second.last_seen < oldest->second.last_seen)
						oldest = k;
				}

				// remove the oldest entry
				m_failed_cache.erase(oldest);
			}

			auto const range = m_callbacks.equal_range(hostname);
			for (auto c = range.first; c != range.second; ++c)
				callback(std::move(c->second), ec, {});
			m_callbacks.erase(range.first, range.second);
			return;
		}

		{
			auto const k = m_failed_cache.find(hostname);
			if (k != m_failed_cache.end())
				m_failed_cache.erase(k);
		}

		dns_cache_entry& ce = m_cache[hostname];
		ce.last_seen = time_now();
		ce.addresses.clear();
		for (auto i : ips)
			ce.addresses.push_back(i.endpoint().address());

		auto const range = m_callbacks.equal_range(hostname);
		for (auto c = range.first; c != range.second; ++c)
			callback(std::move(c->second), ec, ce.addresses);
		m_callbacks.erase(range.first, range.second);

		// if m_cache grows too big, weed out the
		// oldest entries
		if (int(m_cache.size()) > m_max_size)
		{
			auto oldest = m_cache.begin();
			for (auto k = m_cache.begin(); k != m_cache.end(); ++k)
			{
				if (k->second.last_seen < oldest->second.last_seen)
					oldest = k;
			}

			// remove the oldest entry
			m_cache.erase(oldest);
		}
	}